

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O0

Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
* __thiscall
Kernel::QKbo::signedAtoms<Kernel::NumTraits<Kernel::RationalConstantType>>(QKbo *this,TermList t)

{
  bool bVar1;
  TermList sort;
  TermList in_RDX;
  QKbo *in_RSI;
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  *in_RDI;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_stack_00000010;
  QKbo *in_stack_00000018;
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  atoms;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  n;
  SignedAtoms *in_stack_00000130;
  QKbo *in_stack_00000138;
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff68;
  TypedTermList local_50;
  InequalityNormalizer *in_stack_ffffffffffffffc8;
  TypedTermList in_stack_ffffffffffffffd0;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffe0;
  QKbo *this_00;
  
  this_00 = in_RSI;
  norm((QKbo *)0x9462ee);
  sort = NumTraits<Kernel::RationalConstantType>::sort();
  TypedTermList::TypedTermList(&local_50,in_RDX,(SortId)sort._content);
  InequalityNormalizer::normalize(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RationalConstantType>>
            ((PolyNf *)in_stack_ffffffffffffff68);
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect((Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             *)&stack0xffffffffffffff60,
            (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
             *)&stack0xffffffffffffffd8);
  divNf<Kernel::NumTraits<Kernel::RationalConstantType>>(in_stack_00000018,in_stack_00000010);
  rmNum<Kernel::NumTraits<Kernel::RationalConstantType>>
            (this_00,(tuple<Kernel::IntegerConstantType,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
                      *)in_stack_ffffffffffffffe0);
  std::
  tuple<Kernel::IntegerConstantType,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
  ::~tuple((tuple<Kernel::IntegerConstantType,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
            *)0x9463bb);
  Lib::
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator*((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x9463c8);
  bVar1 = hasSubstitutionProperty(in_stack_00000138,in_stack_00000130);
  if (bVar1) {
    Lib::
    Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    ::OptionBase((Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
                  *)CONCAT17(bVar1,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
  }
  else {
    *(undefined8 *)
     &in_RDI->
      super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
         = 0;
    (in_RDI->
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    )._elem._elem.init._self._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false> =
         (_Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>)0x0;
    *(undefined8 *)
     ((long)&(in_RDI->
             super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
             )._elem._elem + 8) = 0;
    Lib::
    Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    ::Option((Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)0x94645b);
  }
  Lib::
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_RSI);
  return in_RDI;
}

Assistant:

Option<Recycled<SignedAtoms>> signedAtoms(TermList t) const
  {
    auto n = norm().normalize(TypedTermList(t, NumTraits::sort())).template wrapPoly<NumTraits>();
    auto atoms = rmNum(divNf(n));
    if (hasSubstitutionProperty(*atoms)) {
      return Option<decltype(atoms)>(std::move(atoms));
    } else {
      return Option<decltype(atoms)>();
    }
  }